

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

void __thiscall
OpenMD::RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
          (RectMatrix<double,6u,6u> *this,uint beginRow,uint beginCol,SquareMatrix3<double> *m)

{
  long lVar1;
  uint j;
  long lVar2;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      *(double *)(this + (ulong)(beginCol + (int)lVar2) * 8 + (ulong)((int)lVar1 + beginRow) * 0x30)
           = (((SquareMatrix<double,_3> *)*(double (*) [3])m)->super_RectMatrix<double,_3U,_3U>).
             data_[0][lVar2];
    }
    m = (SquareMatrix3<double> *)((long)m + 0x18);
  }
  return;
}

Assistant:

void setSubMatrix(unsigned int beginRow, unsigned int beginCol,
                      const MatrixType& m) {
      assert(beginRow + m.getNRow() - 1 <= getNRow());
      assert(beginCol + m.getNCol() - 1 <= getNCol());

      for (unsigned int i = 0; i < m.getNRow(); ++i)
        for (unsigned int j = 0; j < m.getNCol(); ++j)
          this->data_[beginRow + i][beginCol + j] = m(i, j);
    }